

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

void gray_hline(PWorker worker,TCoord x,TCoord y,TPos area,int acount)

{
  int iVar1;
  int local_44;
  int skip;
  int count;
  PVG_FT_Span *span;
  int coverage;
  int acount_local;
  TPos area_local;
  TCoord y_local;
  TCoord x_local;
  PWorker worker_local;
  
  span._0_4_ = (uint)(area >> 9);
  if ((int)(uint)span < 0) {
    span._0_4_ = -(uint)span;
  }
  if (((worker->outline).flags & 2U) == 0) {
    if (0xff < (int)(uint)span) {
      span._0_4_ = 0xff;
    }
  }
  else {
    span._0_4_ = (uint)span & 0x1ff;
    if ((uint)span < 0x101) {
      if ((uint)span == 0x100) {
        span._0_4_ = 0xff;
      }
    }
    else {
      span._0_4_ = 0x200 - (uint)span;
    }
  }
  area_local = worker->min_ey + y;
  y_local = worker->min_ex + x;
  if (0x7fffff < y_local) {
    y_local = 0x7fffff;
  }
  if (0x7fffff < area_local) {
    area_local = 0x7fffff;
  }
  if ((uint)span != 0) {
    iVar1 = worker->num_gray_spans;
    if ((((iVar1 < 1) || (worker->gray_spans[(long)iVar1 + -1].y != area_local)) ||
        (worker->gray_spans[(long)iVar1 + -1].x + worker->gray_spans[(long)iVar1 + -1].len !=
         y_local)) || (worker->gray_spans[(long)iVar1 + -1].coverage != (uint)span)) {
      if (iVar1 < 0x100) {
        _skip = worker->gray_spans + iVar1;
      }
      else {
        if ((worker->render_span != (PVG_FT_SpanFunc)0x0) && (worker->skip_spans < iVar1)) {
          if (worker->skip_spans < 1) {
            local_44 = 0;
          }
          else {
            local_44 = worker->skip_spans;
          }
          (*worker->render_span)
                    (worker->num_gray_spans - local_44,worker->gray_spans + local_44,
                     worker->render_span_data);
        }
        worker->skip_spans = worker->skip_spans - worker->num_gray_spans;
        worker->num_gray_spans = 0;
        _skip = worker->gray_spans;
      }
      _skip->x = (int)y_local;
      _skip->len = acount;
      _skip->y = (int)area_local;
      _skip->coverage = (uchar)(uint)span;
      worker->num_gray_spans = worker->num_gray_spans + 1;
    }
    else {
      worker->gray_spans[(long)iVar1 + -1].len = worker->gray_spans[(long)iVar1 + -1].len + acount;
    }
  }
  return;
}

Assistant:

static void
  gray_hline( RAS_ARG_ TCoord  x,
                       TCoord  y,
                       TPos    area,
                       int     acount )
  {
    int coverage;


    /* compute the coverage line's coverage, depending on the    */
    /* outline fill rule                                         */
    /*                                                           */
    /* the coverage percentage is area/(PIXEL_BITS*PIXEL_BITS*2) */
    /*                                                           */
    coverage = (int)( area >> ( PIXEL_BITS * 2 + 1 - 8 ) );
                                                    /* use range 0..256 */
    if ( coverage < 0 )
      coverage = -coverage;

    if ( ras.outline.flags & PVG_FT_OUTLINE_EVEN_ODD_FILL )
    {
      coverage &= 511;

      if ( coverage > 256 )
        coverage = 512 - coverage;
      else if ( coverage == 256 )
        coverage = 255;
    }
    else
    {
      /* normal non-zero winding rule */
      if ( coverage >= 256 )
        coverage = 255;
    }

    y += (TCoord)ras.min_ey;
    x += (TCoord)ras.min_ex;

    /* PVG_FT_Span.x is an int, so limit our coordinates appropriately */
    if ( x >= (1 << 23) )
      x = (1 << 23) - 1;

    /* PVG_FT_Span.y is an int, so limit our coordinates appropriately */
    if ( y >= (1 << 23) )
      y = (1 << 23) - 1;

    if ( coverage )
    {
      PVG_FT_Span*  span;
      int       count;
      int       skip;

      /* see whether we can add this span to the current list */
      count = ras.num_gray_spans;
      span  = ras.gray_spans + count - 1;
      if ( count > 0                          &&
           span->y == y                       &&
           span->x + span->len == x           &&
           span->coverage == coverage         )
      {
        span->len = span->len + acount;
        return;
      }

      if ( count >= PVG_FT_MAX_GRAY_SPANS )
      {
        if ( ras.render_span && count > ras.skip_spans )
        {
          skip = ras.skip_spans > 0 ? ras.skip_spans : 0;
          ras.render_span( ras.num_gray_spans - skip,
                           ras.gray_spans + skip,
                           ras.render_span_data );
        }

        ras.skip_spans -= ras.num_gray_spans;
        /* ras.render_span( span->y, ras.gray_spans, count ); */
        ras.num_gray_spans = 0;

        span  = ras.gray_spans;
      }
      else
        span++;

      /* add a gray span to the current list */
      span->x        = x;
      span->len      = acount;
      span->y        = y;
      span->coverage = (unsigned char)coverage;

      ras.num_gray_spans++;
    }
  }